

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  TPZTensor<TFad<6,_double>_> *local_a0;
  TFad<6,_double> local_70;
  
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01877ca0;
  local_a0 = this->fExtAlloc;
  lVar5 = 0;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].fData.fExtAlloc[0].dx_ + lVar5 + -0x38) =
         &PTR__TPZTensor_018777a0;
    local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
    local_70.dx_[3] = 0.0;
    local_70.dx_[4] = 0.0;
    local_70.dx_[1] = 0.0;
    local_70.dx_[2] = 0.0;
    local_70.val_ = 0.0;
    local_70.dx_[0] = 0.0;
    local_70.dx_[5] = 0.0;
    TPZManVector<TFad<6,_double>,_6>::TPZManVector
              ((TPZManVector<TFad<6,_double>,_6> *)
               ((long)this->fExtAlloc[0].fData.fExtAlloc[0].dx_ + lVar5 + -0x30),6,&local_70);
    lVar5 = lVar5 + 0x1a8;
  } while (lVar5 != 0x4f8);
  uVar6 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
  if ((long)uVar6 < 4) {
    uVar2 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar2 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar4 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar4 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar3 = (ulong *)operator_new__(uVar4);
    *puVar3 = uVar6;
    local_a0 = (TPZTensor<TFad<6,_double>_> *)(puVar3 + 1);
    lVar5 = 0;
    do {
      *(undefined ***)((long)puVar3 + lVar5 + 8) = &PTR__TPZTensor_018777a0;
      local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
      local_70.dx_[3] = 0.0;
      local_70.dx_[4] = 0.0;
      local_70.dx_[1] = 0.0;
      local_70.dx_[2] = 0.0;
      local_70.val_ = 0.0;
      local_70.dx_[0] = 0.0;
      local_70.dx_[5] = 0.0;
      TPZManVector<TFad<6,_double>,_6>::TPZManVector
                ((TPZManVector<TFad<6,_double>,_6> *)((long)puVar3 + lVar5 + 0x10),6,&local_70);
      lVar5 = lVar5 + 0x1a8;
      uVar2 = uVar6;
    } while (uVar6 * 0x1a8 - lVar5 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = local_a0;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar6;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar2;
  if (0 < (long)uVar6) {
    lVar5 = 8;
    do {
      TPZManVector<TFad<6,_double>,_6>::operator=
                ((TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar5 + -0x38),
                 (TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar5 + -0x38));
      lVar5 = lVar5 + 0x1a8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}